

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O3

int rng_nextrand(RNG_state *mystate)

{
  sha1_ctx local_78;
  
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  local_78.hash[0] = 0x67452301;
  local_78.hash[1] = 0xefcdab89;
  local_78.hash[2] = 0x98badcfe;
  local_78.hash[3] = 0x10325476;
  local_78.hash[4] = 0xc3d2e1f0;
  sha1_hash(mystate,0x14,&local_78);
  sha1_end(mystate,&local_78);
  return (mystate[0x10] & 0x7f) << 0x18 | (uint)mystate[0x11] << 0x10 | (uint)mystate[0x12] << 8 |
         (uint)mystate[0x13];
}

Assistant:

int rng_nextrand(RNG_state *mystate){
	struct sha1_context ctx;
	int r;
	uint_32t b;

	sha1_begin(&ctx);
	sha1_hash(mystate, 20, &ctx);
	sha1_end(mystate, &ctx);
	b =  (mystate[16] << 24) | (mystate[17] << 16)
		| (mystate[18] << 8) | (mystate[19] << 0);
	b = b & POS_MASK;
	
	r = (int) b;
	return r;
}